

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32Helper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  bool bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  ostringstream local_1f8 [8];
  ostringstream ss;
  undefined1 local_78 [4];
  uint32_t bit_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint32_t local_34;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfStack_30;
  uint32_t underlying_type_local;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  local_34 = underlying_type;
  pfStack_30 = diag;
  diag_local = (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  bVar2 = ValidationState_t::IsFloatScalarType(this->_,underlying_type);
  pfVar1 = pfStack_30;
  if (bVar2) {
    uVar3 = ValidationState_t::GetBitWidth(this->_,local_34);
    if (uVar3 == 0x20) {
      this_local._4_4_ = SPV_SUCCESS;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_218,this,(Decoration *)inst_local,(Instruction *)diag_local);
      poVar4 = std::operator<<((ostream *)local_1f8,(string *)&local_218);
      poVar4 = std::operator<<(poVar4," has bit width ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      std::operator<<(poVar4,".");
      std::__cxx11::string::~string((string *)&local_218);
      pfVar1 = pfStack_30;
      std::__cxx11::ostringstream::str();
      this_local._4_4_ =
           std::
           function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(pfVar1,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
    }
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              ((string *)local_78,this,(Decoration *)inst_local,(Instruction *)diag_local);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   " is not a float scalar.");
    this_local._4_4_ =
         std::
         function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         ::operator()(pfVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_78);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32Helper(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  if (!_.IsFloatScalarType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " is not a float scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(underlying_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has bit width " << bit_width
       << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}